

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

int xml_writer_write_attributef(xml_writer *ctx,char *key,char *format,...)

{
  int iVar1;
  va_list ap;
  
  iVar1 = xmlTextWriterWriteVFormatAttribute(ctx->writer,"id","%d");
  return iVar1;
}

Assistant:

static int
xml_writer_write_attributef(struct xml_writer *ctx,
    const char *key, const char *format, ...)
{
	va_list ap;
	int ret;
	va_start(ap, format);
	ret = xmlTextWriterWriteVFormatAttribute(ctx->writer,
	    BAD_CAST_CONST(key), format, ap);
	va_end(ap);
	return (ret);
}